

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O2

libcaption_stauts_t caption_frame_decode_control(caption_frame_t *frame,uint16_t cc_data)

{
  byte bVar1;
  eia608_control_t eVar2;
  libcaption_stauts_t lVar3;
  caption_frame_buffer_t *pcVar4;
  int cc;
  
  eVar2 = eia608_parse_control(cc_data,&cc);
  lVar3 = LIBCAPTION_OK;
  switch(eVar2) {
  case eia608_control_resume_caption_loading:
    *(byte *)&frame->state = *(byte *)&frame->state & 0xcf;
    pcVar4 = &frame->back;
    goto LAB_001164bc;
  case eia608_control_backspace:
    caption_frame_backspace(frame);
    goto LAB_001164ae;
  case eia608_control_alarm_off:
  case eia608_control_alarm_on:
  case 0x1428:
  case eia608_control_text_restart:
  case eia608_control_text_resume_text_display:
    break;
  case eia608_control_delete_to_end_of_row:
    caption_frame_delete_to_end_of_row(frame);
    goto LAB_001164ae;
  case eia608_control_roll_up_2:
    bVar1 = *(byte *)&frame->state & 0xcf | 0x10;
    goto LAB_00116481;
  case eia608_control_roll_up_3:
    bVar1 = *(byte *)&frame->state & 0xcf | 0x20;
LAB_00116481:
    *(byte *)&frame->state = bVar1;
    goto LAB_001164b8;
  case eia608_control_roll_up_4:
    *(byte *)&frame->state = *(byte *)&frame->state | 0x30;
    goto LAB_001164b8;
  case eia608_control_resume_direct_captioning:
    *(byte *)&frame->state = *(byte *)&frame->state & 0xcf;
LAB_001164b8:
    pcVar4 = &frame->front;
LAB_001164bc:
    frame->write = pcVar4;
    break;
  case eia608_control_erase_display_memory:
    pcVar4 = &frame->front;
    goto LAB_0011649f;
  case eia608_control_carriage_return:
    lVar3 = caption_frame_carriage_return(frame);
    break;
  case eia608_control_erase_non_displayed_memory:
    memset(&frame->back,0,0xf00);
    break;
  case eia608_control_end_of_caption:
    pcVar4 = &frame->back;
    memcpy(&frame->front,pcVar4,0xf00);
LAB_0011649f:
    memset(pcVar4,0,0xf00);
LAB_001164ae:
    lVar3 = LIBCAPTION_READY;
    break;
  default:
    if (eVar2 - eia608_tab_offset_0 < 4) {
      (frame->state).col = (char)eVar2 + (frame->state).col + -0x20;
    }
  }
  return lVar3;
}

Assistant:

libcaption_stauts_t caption_frame_decode_control(caption_frame_t* frame, uint16_t cc_data)
{
    int cc;
    eia608_control_t cmd = eia608_parse_control(cc_data, &cc);

    switch (cmd) {
    // PAINT ON
    case eia608_control_resume_direct_captioning:
        frame->state.rup = 0;
        frame->write = &frame->front;
        return LIBCAPTION_OK;

    case eia608_control_erase_display_memory:
        caption_frame_buffer_clear(&frame->front);
        return LIBCAPTION_READY;

    // ROLL-UP
    case eia608_control_roll_up_2:
        frame->state.rup = 1;
        frame->write = &frame->front;
        return LIBCAPTION_OK;

    case eia608_control_roll_up_3:
        frame->state.rup = 2;
        frame->write = &frame->front;
        return LIBCAPTION_OK;

    case eia608_control_roll_up_4:
        frame->state.rup = 3;
        frame->write = &frame->front;
        return LIBCAPTION_OK;

    case eia608_control_carriage_return:
        return caption_frame_carriage_return(frame);

    // Corrections (Is this only valid as part of paint on?)
    case eia608_control_backspace:
        return caption_frame_backspace(frame);
    case eia608_control_delete_to_end_of_row:
        return caption_frame_delete_to_end_of_row(frame);

    // POP ON
    case eia608_control_resume_caption_loading:
        frame->state.rup = 0;
        frame->write = &frame->back;
        return LIBCAPTION_OK;

    case eia608_control_erase_non_displayed_memory:
        caption_frame_buffer_clear(&frame->back);
        return LIBCAPTION_OK;

    case eia608_control_end_of_caption:
        return caption_frame_end(frame);

    // cursor positioning
    case eia608_tab_offset_0:
    case eia608_tab_offset_1:
    case eia608_tab_offset_2:
    case eia608_tab_offset_3:
        frame->state.col += (cmd - eia608_tab_offset_0);
        return LIBCAPTION_OK;

    // Unhandled
    default:
    case eia608_control_alarm_off:
    case eia608_control_alarm_on:
    case eia608_control_text_restart:
    case eia608_control_text_resume_text_display:
        return LIBCAPTION_OK;
    }
}